

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_grouping(lyout *out,lys_node *node,int *first)

{
  char *label;
  lys_module *plVar1;
  lys_node_grp *group;
  int *first_local;
  lys_node *node_local;
  lyout *out_local;
  
  label = node->name;
  plVar1 = lys_main_module(node->module);
  jsons_print_object(out,label,"module",plVar1->name,0,first);
  if ((*(ushort *)&node->module->field_0x40 & 1) != 0) {
    ly_print(out,",\"included-from\":\"%s\"",node->module->name);
  }
  jsons_print_text(out,"description","text",node->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",node->ref,1,(int *)0x0);
  jsons_print_status(out,node->flags,(int *)0x0);
  jsons_print_typedefs
            (out,*(lys_tpdf **)node->hash,(uint8_t)*(undefined2 *)(node->padding + 2),(int *)0x0);
  jsons_print_groupings(out,node->child,(int *)0x0);
  jsons_print_data(out,node->module,node->child,(int *)0x0);
  jsons_print_actions(out,node->child,(int *)0x0);
  jsons_print_notifs(out,node->child,(int *)0x0);
  ly_print(out,"}");
  return;
}

Assistant:

static void
jsons_print_grouping(struct lyout *out, const struct lys_node *node, int *first)
{
    struct lys_node_grp *group = (struct lys_node_grp *)node;

    jsons_print_object(out, node->name, "module", lys_main_module(node->module)->name, 0, first);
    if (node->module->type) {
        ly_print(out, ",\"included-from\":\"%s\"", node->module->name);
    }
    jsons_print_text(out, "description", "text", group->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", group->ref, 1, NULL);
    jsons_print_status(out, group->flags, NULL);
    jsons_print_typedefs(out, group->tpdf, group->tpdf_size, NULL);

    jsons_print_groupings(out, group->child, NULL);
    jsons_print_data(out, group->module, group->child, NULL);
    jsons_print_actions(out, group->child, NULL);
    jsons_print_notifs(out, group->child, NULL);
    ly_print(out, "}");
}